

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_avx2.c
# Opt level: O2

_Bool av1_resize_vert_dir_avx2
                (uint8_t *intbuf,uint8_t *output,int out_stride,int height,int height2,int stride,
                int start_col)

{
  int iVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  __m256i alVar14;
  _Bool _Var15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  undefined4 in_register_0000000c;
  undefined8 uVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  int i;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  uint8_t *puVar31;
  undefined1 auVar32 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  __m256i res_out [2];
  __m256i res_out_b [2];
  __m256i s [10];
  __m256i coeffs_y [4];
  __m256i local_440;
  longlong local_420;
  longlong lStack_418;
  longlong lStack_410;
  longlong lStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [12];
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  ulong local_368;
  undefined8 local_360;
  ulong local_358;
  long local_350;
  undefined1 (*local_348) [16];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  longlong local_2c0;
  longlong lStack_2b8;
  longlong lStack_2b0;
  longlong lStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  __m256i local_240;
  undefined1 local_220 [32];
  __m256i local_200;
  __m256i local_1e0;
  undefined1 local_1c0 [32];
  __m256i local_1a0;
  undefined1 local_180 [32];
  __m256i local_160;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  longlong local_e0 [22];
  ulong uVar28;
  undefined1 auVar33 [16];
  
  uVar19 = CONCAT44(in_register_0000000c,height);
  if (7 < height && (height & 1U) == 0) {
    local_e0[8] = 0xc380c380c380c38;
    local_e0[9] = 0xc380c380c380c38;
    local_e0[10] = 0xc380c380c380c38;
    local_e0[0xb] = 0xc380c380c380c38;
    local_e0[0xc] = 0xfffdfffdfffdfffd;
    local_e0[0xd] = 0xfffdfffdfffdfffd;
    local_e0[0xe] = 0xfffdfffdfffdfffd;
    local_e0[0xf] = 0xfffdfffdfffdfffd;
    local_e0[0] = -0x200020002000201;
    local_e0[1] = -0x200020002000201;
    local_e0[2] = -0x200020002000201;
    local_e0[3] = -0x200020002000201;
    local_e0[4] = 0x380c380c380c380c;
    local_e0[5] = 0x380c380c380c380c;
    local_e0[6] = 0x380c380c380c380c;
    local_e0[7] = 0x380c380c380c380c;
    iVar16 = stride / 0x10;
    iVar20 = stride % 0x10;
    lVar23 = (long)stride;
    uVar22 = (ulong)(height - (height & 2U | 4));
    uVar27 = height - 1;
    uVar28 = (ulong)uVar27;
    lVar21 = (long)out_stride;
    lVar24 = (long)start_col;
    local_350 = (long)(iVar16 * 0x10);
    pauVar29 = (undefined1 (*) [16])(output + lVar24);
    local_368 = (ulong)(height & 0x7ffffffc);
    local_358 = local_368 - 2;
    local_3c0._0_4_ = stride;
    local_360 = uVar19;
    for (; lVar24 < local_350; lVar24 = lVar24 + 0x10) {
      auVar32 = *(undefined1 (*) [16])(intbuf + lVar24);
      auVar33 = *(undefined1 (*) [16])(intbuf + lVar23 + lVar24);
      auVar41 = *(undefined1 (*) [16])(intbuf + lVar23 * 2 + lVar24);
      auVar49 = *(undefined1 (*) [16])(intbuf + lVar23 * 3 + lVar24);
      auVar53 = *(undefined1 (*) [16])(intbuf + lVar23 * 4 + lVar24);
      auVar52._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar32;
      auVar52._16_16_ = ZEXT116(1) * auVar33;
      auVar56._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar32;
      auVar56._16_16_ = ZEXT116(1) * auVar41;
      auVar37._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar33;
      auVar37._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar49;
      auVar44._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar41;
      auVar44._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
      auVar33 = vpunpcklbw_avx(auVar32,auVar32);
      local_280 = vpermq_avx2(ZEXT1632(auVar33),0x44);
      local_260 = vpunpcklbw_avx2(auVar52,auVar56);
      local_240 = (__m256i)vpunpcklbw_avx2(auVar37,auVar44);
      auVar32 = vpunpckhbw_avx(auVar32,auVar32);
      local_1e0 = (__m256i)vpermq_avx2(ZEXT1632(auVar32),0x44);
      local_1c0 = vpunpckhbw_avx2(auVar52,auVar56);
      local_1a0 = (__m256i)vpunpckhbw_avx2(auVar37,auVar44);
      uVar25 = 0;
      local_348 = pauVar29;
      while( true ) {
        alVar14 = local_1a0;
        auVar58 = ZEXT1664(auVar53);
        auVar57 = ZEXT1664(auVar49);
        uVar30 = local_358;
        local_440 = local_1a0;
        _local_3a0 = local_240;
        if (uVar22 <= uVar25) break;
        iVar1 = (int)uVar25;
        uVar17 = iVar1 + 5U;
        if ((int)uVar27 < (int)(iVar1 + 5U)) {
          uVar17 = uVar27;
        }
        uVar18 = iVar1 + 6U;
        if ((int)uVar27 < (int)(iVar1 + 6U)) {
          uVar18 = uVar27;
        }
        auVar32 = *(undefined1 (*) [16])(intbuf + (int)(uVar17 * stride) + lVar24);
        local_2e0 = ZEXT1632(auVar32);
        auVar33 = *(undefined1 (*) [16])(intbuf + (int)(uVar18 * stride) + lVar24);
        local_300 = ZEXT1632(auVar33);
        auVar36._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar49;
        auVar36._16_16_ = ZEXT116(1) * auVar32;
        auVar43._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar53;
        auVar43._16_16_ = ZEXT116(1) * auVar33;
        local_340 = vpunpcklbw_avx2(auVar36,auVar43);
        local_3e0 = vpunpckhbw_avx2(auVar36,auVar43);
        local_400 = 0;
        uStack_3f8 = 0;
        uStack_3f0 = 0;
        uStack_3e8 = 0;
        local_420 = 0;
        lStack_418 = 0;
        lStack_410 = 0;
        lStack_408 = 0;
        local_220 = local_340;
        local_180 = local_3e0;
        resize_convolve((__m256i *)local_280,(__m256i *)local_e0,(__m256i *)&local_420);
        local_140._8_4_ = 0x40;
        local_140._0_8_ = 0x4000000040;
        local_140._12_4_ = 0x40;
        local_140._16_4_ = 0x40;
        local_140._20_4_ = 0x40;
        local_140._24_4_ = 0x40;
        local_140._28_4_ = 0x40;
        auVar2._8_8_ = lStack_418;
        auVar2._0_8_ = local_420;
        auVar2._16_8_ = lStack_410;
        auVar2._24_8_ = lStack_408;
        auVar37 = vpaddd_avx2(local_140,auVar2);
        auVar6._8_8_ = uStack_3f8;
        auVar6._0_8_ = local_400;
        auVar6._16_8_ = uStack_3f0;
        auVar6._24_8_ = uStack_3e8;
        auVar44 = vpaddd_avx2(local_140,auVar6);
        auVar37 = vpsrad_avx2(auVar37,7);
        auVar44 = vpsrad_avx2(auVar44,7);
        local_320 = vpackusdw_avx2(auVar37,auVar44);
        local_2a0 = 0;
        uStack_298 = 0;
        uStack_290 = 0;
        uStack_288 = 0;
        local_2c0 = 0;
        lStack_2b8 = 0;
        lStack_2b0 = 0;
        lStack_2a8 = 0;
        stride = local_3c0._0_4_;
        resize_convolve(&local_1e0,(__m256i *)local_e0,(__m256i *)&local_2c0);
        auVar10._8_8_ = lStack_2b8;
        auVar10._0_8_ = local_2c0;
        auVar10._16_8_ = lStack_2b0;
        auVar10._24_8_ = lStack_2a8;
        auVar37 = vpaddd_avx2(local_140,auVar10);
        auVar12._8_8_ = uStack_298;
        auVar12._0_8_ = local_2a0;
        auVar12._16_8_ = uStack_290;
        auVar12._24_8_ = uStack_288;
        auVar44 = vpaddd_avx2(local_140,auVar12);
        auVar37 = vpsrad_avx2(auVar37,7);
        auVar44 = vpsrad_avx2(auVar44,7);
        auVar37 = vpackusdw_avx2(auVar37,auVar44);
        auVar44 = vpermq_avx2(local_320,0xd8);
        auVar37 = vpermq_avx2(auVar37,0xd8);
        auVar37 = vpackuswb_avx2(auVar44,auVar37);
        *pauVar29 = auVar37._0_16_;
        *(undefined1 (*) [16])(*pauVar29 + lVar21) = auVar37._16_16_;
        uVar17 = iVar1 + 7U;
        if ((int)uVar27 < (int)(iVar1 + 7U)) {
          uVar17 = uVar27;
        }
        uVar18 = iVar1 + 8U;
        if ((int)uVar27 < (int)(iVar1 + 8U)) {
          uVar18 = uVar27;
        }
        auVar49 = *(undefined1 (*) [16])(intbuf + (int)(uVar17 * stride) + lVar24);
        auVar53 = *(undefined1 (*) [16])(intbuf + (int)(uVar18 * stride) + lVar24);
        auVar38._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * local_2e0._0_16_;
        auVar38._16_16_ = ZEXT116(0) * local_2e0._16_16_ + ZEXT116(1) * auVar49;
        auVar45._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * local_300._0_16_;
        auVar45._16_16_ = ZEXT116(0) * local_300._16_16_ + ZEXT116(1) * auVar53;
        local_240 = (__m256i)vpunpcklbw_avx2(auVar38,auVar45);
        local_160 = (__m256i)vpunpckhbw_avx2(auVar38,auVar45);
        local_280._0_8_ = local_3a0._0_8_;
        local_280._8_8_ = stack0xfffffffffffffc68;
        local_280._16_8_ = _uStack_390;
        local_280._24_8_ = _uStack_388;
        local_260 = local_340;
        local_1a0[0] = alVar14[0];
        local_1a0[1] = alVar14[1];
        local_1a0[2] = alVar14[2];
        local_1a0[3] = alVar14[3];
        local_1e0[0] = local_1a0[0];
        local_1e0[1] = local_1a0[1];
        local_1e0[2] = local_1a0[2];
        local_1e0[3] = local_1a0[3];
        local_1c0 = local_3e0;
        uVar25 = uVar25 + 4;
        pauVar29 = (undefined1 (*) [16])(*pauVar29 + lVar21 * 2);
        local_200 = local_240;
        local_1a0 = local_160;
      }
      for (; (long)(uVar30 - 2) < (long)uVar28; uVar30 = uVar30 + 4) {
        iVar1 = (int)uVar30;
        uVar17 = iVar1 + 3U;
        if ((int)uVar27 < (int)(iVar1 + 3U)) {
          uVar17 = uVar27;
        }
        uVar18 = iVar1 + 4U;
        if ((int)uVar27 < (int)(iVar1 + 4U)) {
          uVar18 = uVar27;
        }
        auVar32 = *(undefined1 (*) [16])(intbuf + (int)(uVar17 * stride) + lVar24);
        auVar33 = *(undefined1 (*) [16])(intbuf + (int)(uVar18 * stride) + lVar24);
        local_2e0 = auVar57._0_32_;
        local_120 = ZEXT1632(auVar32);
        auVar39._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar57._0_16_;
        auVar39._16_16_ = ZEXT116(0) * auVar57._16_16_ + ZEXT116(1) * auVar32;
        local_300 = auVar58._0_32_;
        local_320 = ZEXT1632(auVar33);
        auVar46._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar58._0_16_;
        auVar46._16_16_ = ZEXT116(0) * auVar58._16_16_ + ZEXT116(1) * auVar33;
        local_220 = vpunpcklbw_avx2(auVar39,auVar46);
        local_180 = vpunpckhbw_avx2(auVar39,auVar46);
        local_400 = 0;
        uStack_3f8 = 0;
        uStack_3f0 = 0;
        uStack_3e8 = 0;
        local_420 = 0;
        lStack_418 = 0;
        lStack_410 = 0;
        lStack_408 = 0;
        local_140 = local_180;
        local_100 = local_220;
        resize_convolve((__m256i *)local_280,(__m256i *)local_e0,(__m256i *)&local_420);
        local_340._8_4_ = 0x40;
        local_340._0_8_ = 0x4000000040;
        local_340._12_4_ = 0x40;
        local_340._16_4_ = 0x40;
        local_340._20_4_ = 0x40;
        local_340._24_4_ = 0x40;
        local_340._28_4_ = 0x40;
        auVar3._8_8_ = lStack_418;
        auVar3._0_8_ = local_420;
        auVar3._16_8_ = lStack_410;
        auVar3._24_8_ = lStack_408;
        auVar37 = vpaddd_avx2(local_340,auVar3);
        auVar7._8_8_ = uStack_3f8;
        auVar7._0_8_ = local_400;
        auVar7._16_8_ = uStack_3f0;
        auVar7._24_8_ = uStack_3e8;
        auVar44 = vpaddd_avx2(local_340,auVar7);
        auVar37 = vpsrad_avx2(auVar37,7);
        auVar44 = vpsrad_avx2(auVar44,7);
        local_3e0 = vpackusdw_avx2(auVar37,auVar44);
        local_2a0 = 0;
        uStack_298 = 0;
        uStack_290 = 0;
        uStack_288 = 0;
        local_2c0 = 0;
        lStack_2b8 = 0;
        lStack_2b0 = 0;
        lStack_2a8 = 0;
        resize_convolve(&local_1e0,(__m256i *)local_e0,(__m256i *)&local_2c0);
        auVar11._8_8_ = lStack_2b8;
        auVar11._0_8_ = local_2c0;
        auVar11._16_8_ = lStack_2b0;
        auVar11._24_8_ = lStack_2a8;
        auVar37 = vpaddd_avx2(local_340,auVar11);
        auVar13._8_8_ = uStack_298;
        auVar13._0_8_ = local_2a0;
        auVar13._16_8_ = uStack_290;
        auVar13._24_8_ = uStack_288;
        auVar44 = vpaddd_avx2(local_340,auVar13);
        auVar37 = vpsrad_avx2(auVar37,7);
        auVar44 = vpsrad_avx2(auVar44,7);
        auVar37 = vpackusdw_avx2(auVar37,auVar44);
        auVar44 = vpermq_avx2(local_3e0,0xd8);
        auVar37 = vpermq_avx2(auVar37,0xd8);
        auVar37 = vpackuswb_avx2(auVar44,auVar37);
        *(undefined1 (*) [16])(output + (int)((iVar1 - 2U >> 1) * out_stride) + lVar24) =
             auVar37._0_16_;
        if ((long)uVar30 < (long)uVar28) {
          *(undefined1 (*) [16])
           (output + (int)(((uint)(uVar30 >> 1) & 0x7fffffff) * out_stride) + lVar24) =
               auVar37._16_16_;
        }
        if ((long)(uVar30 + 2) < (long)uVar28) {
          auVar33 = local_120._0_16_;
          auVar32 = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar33;
          auVar58 = ZEXT3264(local_320);
          auVar49 = local_320._0_16_;
          auVar41 = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar49;
          auVar40._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar32;
          auVar40._16_16_ =
               ZEXT116(0) * (ZEXT116(0) * local_120._16_16_ + ZEXT116(1) * auVar33) +
               ZEXT116(1) * auVar41;
          auVar47._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar49;
          auVar47._16_16_ = ZEXT116(0) * local_320._16_16_ + ZEXT116(1) * auVar49;
          local_240 = (__m256i)vpunpcklbw_avx2(auVar40,auVar47);
          local_1a0 = (__m256i)vpunpckhbw_avx2(auVar40,auVar47);
          local_280._0_8_ = local_3a0._0_8_;
          local_280._8_8_ = stack0xfffffffffffffc68;
          local_280._16_8_ = _uStack_390;
          local_280._24_8_ = _uStack_388;
          local_260 = local_100;
          local_1e0[0] = local_440[0];
          local_1e0[1] = local_440[1];
          local_1e0[2] = local_440[2];
          local_1e0[3] = local_440[3];
          local_1c0 = local_140;
          auVar57 = ZEXT1664(auVar49);
          local_440 = local_1a0;
          _local_3a0 = local_240;
          local_200 = local_240;
          local_160 = local_1a0;
        }
        else {
          auVar58 = ZEXT1664(local_300._0_16_);
          auVar57 = ZEXT3264(local_2e0);
        }
        stride = local_3c0._0_4_;
      }
      pauVar29 = local_348 + 1;
    }
    if (7 < iVar20) {
      lVar24 = (long)iVar16 * 0x10;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(intbuf + lVar23 + lVar24);
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(intbuf + lVar23 * 2 + lVar24);
      local_260._16_16_ = vpunpcklbw_avx(auVar33,auVar41);
      uVar25 = *(ulong *)(intbuf + lVar23 * 3 + lVar24);
      uVar30 = *(ulong *)(intbuf + lVar23 * 4 + lVar24);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(intbuf + lVar24);
      local_280._16_16_ = vpunpcklbw_avx(auVar32,auVar32);
      auVar49._8_8_ = 0;
      auVar49._0_8_ = uVar25;
      auVar53._8_8_ = 0;
      auVar53._0_8_ = uVar30;
      auVar32 = vpunpcklbw_avx(auVar49,auVar53);
      local_280._0_16_ = local_280._16_16_;
      local_260._0_16_ = local_280._16_16_;
      local_240._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * local_260._16_16_;
      local_240._16_16_ = ZEXT116(1) * auVar32;
      local_340._0_8_ = lVar24;
      puVar31 = output + lVar24;
      uVar26 = 0;
      local_3a0._8_4_ = 0x40;
      local_3a0._0_8_ = 0x4000000040;
      uStack_394 = 0x40;
      uStack_390 = 0x40;
      uStack_38c = 0x40;
      uStack_388 = 0x40;
      uStack_384 = 0x40;
      while( true ) {
        alVar14 = local_240;
        auVar58 = ZEXT864(uVar30);
        auVar57 = ZEXT864(uVar25);
        if (uVar22 <= uVar26) break;
        iVar16 = (int)uVar26;
        uVar17 = iVar16 + 5U;
        if ((int)uVar27 < (int)(iVar16 + 5U)) {
          uVar17 = uVar27;
        }
        uVar18 = iVar16 + 6U;
        if ((int)uVar27 < (int)(iVar16 + 6U)) {
          uVar18 = uVar27;
        }
        auVar34._8_8_ = 0;
        auVar34._0_8_ = *(ulong *)(intbuf + (int)(uVar17 * stride) + lVar24);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = *(ulong *)(intbuf + (int)(uVar18 * stride) + lVar24);
        auVar32 = vpunpcklbw_avx(auVar34,auVar42);
        local_3e0 = ZEXT1632(auVar32);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = uVar25;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = uVar30;
        auVar33 = vpunpcklbw_avx(auVar50,auVar54);
        local_3c0._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * auVar33;
        local_3c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar32;
        local_400 = 0;
        uStack_3f8 = 0;
        uStack_3f0 = 0;
        uStack_3e8 = 0;
        local_420 = 0;
        lStack_418 = 0;
        lStack_410 = 0;
        lStack_408 = 0;
        local_220 = local_3c0;
        resize_convolve((__m256i *)local_280,(__m256i *)local_e0,(__m256i *)&local_420);
        auVar4._8_8_ = lStack_418;
        auVar4._0_8_ = local_420;
        auVar4._16_8_ = lStack_410;
        auVar4._24_8_ = lStack_408;
        auVar37 = vpaddd_avx2((undefined1  [32])_local_3a0,auVar4);
        auVar8._8_8_ = uStack_3f8;
        auVar8._0_8_ = local_400;
        auVar8._16_8_ = uStack_3f0;
        auVar8._24_8_ = uStack_3e8;
        auVar44 = vpaddd_avx2((undefined1  [32])_local_3a0,auVar8);
        auVar37 = vpsrad_avx2(auVar37,7);
        auVar44 = vpsrad_avx2(auVar44,7);
        auVar37 = vpackusdw_avx2(auVar37,auVar44);
        auVar37 = vpermq_avx2(auVar37,0xd8);
        auVar37 = vpackuswb_avx2(auVar37,auVar37);
        *(long *)puVar31 = auVar37._0_8_;
        uVar17 = iVar16 + 7U;
        if ((int)uVar27 < (int)(iVar16 + 7U)) {
          uVar17 = uVar27;
        }
        uVar18 = iVar16 + 8U;
        if ((int)uVar27 < (int)(iVar16 + 8U)) {
          uVar18 = uVar27;
        }
        *(long *)(puVar31 + lVar21) = auVar37._16_8_;
        uVar25 = *(ulong *)(intbuf + (int)(uVar17 * stride) + lVar24);
        uVar30 = *(ulong *)(intbuf + (int)(uVar18 * stride) + lVar24);
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar25;
        auVar55._8_8_ = 0;
        auVar55._0_8_ = uVar30;
        auVar32 = vpunpcklbw_avx(auVar51,auVar55);
        local_200._0_16_ = ZEXT116(0) * auVar32 + ZEXT116(1) * local_3e0._0_16_;
        local_200._16_16_ = ZEXT116(0) * local_3e0._16_16_ + ZEXT116(1) * auVar32;
        local_240[0] = alVar14[0];
        local_240[1] = alVar14[1];
        local_240[2] = alVar14[2];
        local_240[3] = alVar14[3];
        local_280._0_8_ = local_240[0];
        local_280._8_8_ = local_240[1];
        local_280._16_8_ = local_240[2];
        local_280._24_8_ = local_240[3];
        local_260 = local_3c0;
        uVar26 = uVar26 + 4;
        puVar31 = puVar31 + lVar21 * 2;
        local_240 = local_200;
      }
      local_440 = local_240;
      for (uVar22 = local_368 - 2; (long)(uVar22 - 2) < (long)uVar28; uVar22 = uVar22 + 4) {
        iVar16 = (int)uVar22;
        uVar17 = iVar16 + 3U;
        if ((int)uVar27 < (int)(iVar16 + 3U)) {
          uVar17 = uVar27;
        }
        uVar18 = iVar16 + 4U;
        if ((int)uVar27 < (int)(iVar16 + 4U)) {
          uVar18 = uVar27;
        }
        local_3c0._0_16_ = auVar57._0_16_;
        local_3e0._0_16_ = auVar58._0_16_;
        auVar32 = vpunpcklbw_avx(auVar57._0_16_,auVar58._0_16_);
        auVar48._8_8_ = 0;
        auVar48._0_8_ = *(ulong *)(intbuf + (int)(uVar18 * stride) + lVar24);
        local_2e0._0_16_ = auVar48;
        auVar35._8_8_ = 0;
        auVar35._0_8_ = *(ulong *)(intbuf + (int)(uVar17 * stride) + lVar24);
        auVar33 = vpunpcklbw_avx(auVar35,auVar48);
        local_320 = ZEXT1632(auVar33);
        local_300._0_16_ = ZEXT116(0) * auVar33 + ZEXT116(1) * auVar32;
        local_300._16_16_ = ZEXT116(1) * auVar33;
        local_400 = 0;
        uStack_3f8 = 0;
        uStack_3f0 = 0;
        uStack_3e8 = 0;
        local_420 = 0;
        lStack_418 = 0;
        lStack_410 = 0;
        lStack_408 = 0;
        local_220 = local_300;
        resize_convolve((__m256i *)local_280,(__m256i *)local_e0,(__m256i *)&local_420);
        auVar5._8_8_ = lStack_418;
        auVar5._0_8_ = local_420;
        auVar5._16_8_ = lStack_410;
        auVar5._24_8_ = lStack_408;
        auVar37 = vpaddd_avx2((undefined1  [32])_local_3a0,auVar5);
        auVar9._8_8_ = uStack_3f8;
        auVar9._0_8_ = local_400;
        auVar9._16_8_ = uStack_3f0;
        auVar9._24_8_ = uStack_3e8;
        auVar44 = vpaddd_avx2((undefined1  [32])_local_3a0,auVar9);
        auVar37 = vpsrad_avx2(auVar37,7);
        auVar44 = vpsrad_avx2(auVar44,7);
        auVar37 = vpackusdw_avx2(auVar37,auVar44);
        auVar37 = vpermq_avx2(auVar37,0xd8);
        auVar37 = vpackuswb_avx2(auVar37,auVar37);
        *(long *)(output + (int)((iVar16 - 2U >> 1) * out_stride + local_340._0_4_)) = auVar37._0_8_
        ;
        if ((long)uVar22 < (long)uVar28) {
          *(long *)(output + (int)(((uint)(uVar22 >> 1) & 0x7fffffff) * out_stride + local_340._0_4_
                                  )) = auVar37._16_8_;
        }
        if ((long)(uVar22 + 2) < (long)uVar28) {
          auVar33 = local_320._0_16_;
          auVar32 = vpunpcklbw_avx(local_2e0._0_16_,local_2e0._0_16_);
          local_240._0_16_ =
               ZEXT116(0) * auVar32 + ZEXT116(1) * (ZEXT116(0) * auVar33 + ZEXT116(1) * auVar33);
          local_240._16_16_ =
               ZEXT116(0) * (ZEXT116(0) * local_320._16_16_ + ZEXT116(1) * auVar33) +
               ZEXT116(1) * auVar32;
          local_280._0_8_ = local_440[0];
          local_280._8_8_ = local_440[1];
          local_280._16_8_ = local_440[2];
          local_280._24_8_ = local_440[3];
          local_260 = local_300;
          auVar32 = local_2e0._0_16_;
          auVar33 = local_2e0._0_16_;
          local_440 = local_240;
          local_200 = local_240;
        }
        else {
          auVar32 = local_3c0._0_16_;
          auVar33 = local_3e0._0_16_;
        }
        auVar58 = ZEXT1664(auVar33);
        auVar57 = ZEXT1664(auVar32);
      }
      iVar20 = stride % 8;
    }
    if (iVar20 == 0) {
      return true;
    }
    start_col = stride - iVar20;
    uVar19 = local_360;
  }
  _Var15 = av1_resize_vert_dir_c(intbuf,output,out_stride,(int)uVar19,height2,stride,start_col);
  return _Var15;
}

Assistant:

bool av1_resize_vert_dir_avx2(uint8_t *intbuf, uint8_t *output, int out_stride,
                              int height, int height2, int stride,
                              int start_col) {
  assert(start_col <= stride);
  // For the GM tool, the input layer height or width is assured to be an even
  // number. Hence the function 'down2_symodd()' is not invoked and SIMD
  // optimization of the same is not implemented.
  // When the input height is less than 8 and even, the potential input
  // heights are limited to 2, 4, or 6. These scenarios require seperate
  // handling due to padding requirements. Invoking the C function here will
  // eliminate the need for conditional statements within the subsequent SIMD
  // code to manage these cases.
  if (height & 1 || height < 8) {
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, start_col);
  }

  __m256i s[10], coeffs_y[4];
  const int bits = FILTER_BITS;

  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const uint8_t max_pixel = 255;
  const __m256i clip_pixel = _mm256_set1_epi8((char)max_pixel);
  const __m256i zero = _mm256_setzero_si256();

  prepare_filter_coeffs(av1_down2_symeven_half_filter, coeffs_y);

  const int num_col16 = stride / 16;
  int remain_col = stride % 16;
  // The core vertical SIMD processes 4 input rows simultaneously to generate
  // output corresponding to 2 rows. To streamline the core loop and eliminate
  // the need for conditional checks, the remaining rows (4 or 6) are processed
  // separately.
  const int remain_row = (height % 4 == 0) ? 4 : 6;

  for (int j = start_col; j < stride - remain_col; j += 16) {
    const uint8_t *data = &intbuf[j];
    const __m128i l3 = _mm_loadu_si128((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with the last available row at the top.
    const __m128i l0 = l3;
    const __m128i l1 = l3;
    const __m128i l2 = l3;
    const __m128i l4 = _mm_loadu_si128((__m128i *)(data + 1 * stride));

    __m128i l6, l7, l8, l9;
    __m128i l5 = _mm_loadu_si128((__m128i *)(data + 2 * stride));
    __m128i l10 = _mm_loadu_si128((__m128i *)(data + 3 * stride));
    __m128i l11 = _mm_loadu_si128((__m128i *)(data + 4 * stride));

    // a0...a15 | c0...c15
    const __m256i s02 =
        _mm256_permute2x128_si256(CAST_HI(l0), CAST_HI(l2), 0x20);
    // b0...b15 | d0...d15
    const __m256i s13 =
        _mm256_permute2x128_si256(CAST_HI(l1), CAST_HI(l3), 0x20);
    // c0...c15 | e0...e15
    const __m256i s24 =
        _mm256_permute2x128_si256(CAST_HI(l2), CAST_HI(l4), 0x20);
    // d0...d15 | f0...f15
    const __m256i s35 =
        _mm256_permute2x128_si256(CAST_HI(l3), CAST_HI(l5), 0x20);
    // e0...e15 | g0...g15
    const __m256i s46 =
        _mm256_permute2x128_si256(CAST_HI(l4), CAST_HI(l10), 0x20);
    // f0...f15 | h0...h15
    const __m256i s57 =
        _mm256_permute2x128_si256(CAST_HI(l5), CAST_HI(l11), 0x20);

    // a0b0...a7b7 | c0d0...c7d7
    s[0] = _mm256_unpacklo_epi8(s02, s13);
    // c0d0...c7d7 | e0f0...e7f7
    s[1] = _mm256_unpacklo_epi8(s24, s35);
    // e0f0...e7f7 | g0h0...g7h7
    s[2] = _mm256_unpacklo_epi8(s46, s57);

    // a8b8...a15b15 | c8d8...c15d15
    s[5] = _mm256_unpackhi_epi8(s02, s13);
    // c8d8...c15d15 | e8f8...e15f15
    s[6] = _mm256_unpackhi_epi8(s24, s35);
    // e8f8...e15f15 | g8h8...g15h15
    s[7] = _mm256_unpackhi_epi8(s46, s57);

    // height to be processed here
    const int process_ht = height - remain_row;
    for (int i = 0; i < process_ht; i += 4) {
      PROCESS_RESIZE_Y_WD16

      _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                       CAST_LOW(res_8bit0));

      _mm_storeu_si128(
          (__m128i *)&output[(i / 2) * out_stride + j + out_stride],
          _mm256_extracti128_si256(res_8bit0, 1));

      // Load the required data for processing of next 4 input rows.
      const int idx7 = AOMMIN(height - 1, i + 7);
      const int idx8 = AOMMIN(height - 1, i + 8);
      l10 = _mm_loadu_si128((__m128i *)(data + idx7 * stride));
      l11 = _mm_loadu_si128((__m128i *)(data + idx8 * stride));

      const __m256i s810 =
          _mm256_permute2x128_si256(CAST_HI(l8), CAST_HI(l10), 0x20);
      const __m256i s911 =
          _mm256_permute2x128_si256(CAST_HI(l9), CAST_HI(l11), 0x20);
      // i0j0... i7j7 | k0l0... k7l7
      s[4] = _mm256_unpacklo_epi8(s810, s911);
      // i8j8... i15j15 | k8l8... k15l15
      s[9] = _mm256_unpackhi_epi8(s810, s911);

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];

      s[5] = s[7];
      s[6] = s[8];
      s[7] = s[9];
    }

    // Process the remaining last 4 or 6 rows here.
    int i = process_ht;
    while (i < height - 1) {
      PROCESS_RESIZE_Y_WD16

      _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                       CAST_LOW(res_8bit0));
      i += 2;

      const int is_store_valid = (i < height - 1);
      if (is_store_valid)
        _mm_storeu_si128((__m128i *)&output[(i / 2) * out_stride + j],
                         _mm256_extracti128_si256(res_8bit0, 1));
      i += 2;

      // Check if there is any remaining height to process. If so, perform the
      // necessary data loading for processing the next row.
      if (i < height - 1) {
        l10 = l11 = l9;
        const __m256i s810 =
            _mm256_permute2x128_si256(CAST_HI(l8), CAST_HI(l10), 0x20);
        const __m256i s911 =
            _mm256_permute2x128_si256(CAST_HI(l9), CAST_HI(l11), 0x20);
        // i0j0... i7j7 | k0l0... k7l7
        s[4] = _mm256_unpacklo_epi8(s810, s911);
        // i8j8... i15j15 | k8l8... k15l15
        s[9] = _mm256_unpackhi_epi8(s810, s911);

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];

        s[5] = s[7];
        s[6] = s[8];
        s[7] = s[9];
      }
    }
  }

  if (remain_col > 7) {
    const int processed_wd = num_col16 * 16;
    remain_col = stride % 8;

    const uint8_t *data = &intbuf[processed_wd];

    const __m128i l3 = _mm_loadl_epi64((__m128i *)(data + 0 * stride));
    // Padding top 3 rows with available top-most row.
    const __m128i l0 = l3;
    const __m128i l1 = l3;
    const __m128i l2 = l3;
    const __m128i l4 = _mm_loadl_epi64((__m128i *)(data + 1 * stride));

    __m128i l6, l7, l8, l9;
    __m128i l5 = _mm_loadl_epi64((__m128i *)(data + 2 * stride));
    __m128i l10 = _mm_loadl_epi64((__m128i *)(data + 3 * stride));
    __m128i l11 = _mm_loadl_epi64((__m128i *)(data + 4 * stride));

    // a0b0...a7b7
    const __m128i s01 = _mm_unpacklo_epi8(l0, l1);
    // c0d0...c7d7
    const __m128i s23 = _mm_unpacklo_epi8(l2, l3);
    // e0f0...e7f7
    const __m128i s45 = _mm_unpacklo_epi8(l4, l5);
    // g0h0...g7h7
    __m128i s67 = _mm_unpacklo_epi8(l10, l11);

    // a0b0...a7b7 | c0d0...c7d7
    s[0] = _mm256_permute2x128_si256(CAST_HI(s01), CAST_HI(s23), 0x20);
    // c0d0...c7d7 | e0f0...e7f7
    s[1] = _mm256_permute2x128_si256(CAST_HI(s23), CAST_HI(s45), 0x20);
    // e0f0...e7f7 | g0h0...g7h7
    s[2] = _mm256_permute2x128_si256(CAST_HI(s45), CAST_HI(s67), 0x20);

    // height to be processed here
    const int process_ht = height - remain_row;
    for (int i = 0; i < process_ht; i += 4) {
      PROCESS_RESIZE_Y_WD8

      _mm_storel_epi64((__m128i *)&output[(i / 2) * out_stride + processed_wd],
                       CAST_LOW(res_a_round_1));

      _mm_storel_epi64(
          (__m128i *)&output[(i / 2) * out_stride + processed_wd + out_stride],
          _mm256_extracti128_si256(res_a_round_1, 1));

      const int idx7 = AOMMIN(height - 1, i + 7);
      const int idx8 = AOMMIN(height - 1, i + 8);
      l10 = _mm_loadl_epi64((__m128i *)(data + idx7 * stride));
      l11 = _mm_loadl_epi64((__m128i *)(data + idx8 * stride));

      // k0l0... k7l7
      const __m128i s10s11 = _mm_unpacklo_epi8(l10, l11);
      // i0j0... i7j7 | k0l0... k7l7
      s[4] = _mm256_permute2x128_si256(CAST_HI(s89), CAST_HI(s10s11), 0x20);

      s[0] = s[2];
      s[1] = s[3];
      s[2] = s[4];
    }

    // Process the remaining last 4 or 6 rows here.
    int i = process_ht;
    while (i < height - 1) {
      PROCESS_RESIZE_Y_WD8

      _mm_storel_epi64((__m128i *)&output[(i / 2) * out_stride + processed_wd],
                       CAST_LOW(res_a_round_1));

      i += 2;

      const int is_store_valid = (i < height - 1);
      if (is_store_valid)
        _mm_storel_epi64(
            (__m128i *)&output[(i / 2) * out_stride + processed_wd],
            _mm256_extracti128_si256(res_a_round_1, 1));
      i += 2;

      // Check rows are still remaining for processing. If yes do the required
      // load of data for the next iteration.
      if (i < height - 1) {
        l10 = l11 = l9;
        // k0l0... k7l7
        const __m128i s10s11 = _mm_unpacklo_epi8(l10, l11);
        // i0j0... i7j7 | k0l0... k7l7
        s[4] = _mm256_permute2x128_si256(CAST_HI(s89), CAST_HI(s10s11), 0x20);

        s[0] = s[2];
        s[1] = s[3];
        s[2] = s[4];
      }
    }
  }

  if (remain_col)
    return av1_resize_vert_dir_c(intbuf, output, out_stride, height, height2,
                                 stride, stride - remain_col);

  return true;
}